

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ECUPort.cc
# Opt level: O2

void __thiscall
SSM::ECUPort::continuousRead(ECUPort *this,Observables *observables,ReadValueCallback *callback)

{
  undefined8 *puVar1;
  int iVar2;
  int i;
  ulong uVar3;
  pointer pbVar4;
  double dVar5;
  Values values;
  Bytes response;
  InvalidChecksum anon_var_0;
  
  buildReadRequest((Bytes *)&anon_var_0,(ECUPort *)observables,observables,true);
  sendRequest(this,(Bytes *)&anon_var_0,3);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&anon_var_0);
  std::vector<std::byte,_std::allocator<std::byte>_>::vector
            (&response,0,(allocator_type *)&anon_var_0);
  std::vector<double,_std::allocator<double>_>::vector
            (&values,*(long *)(observables + 8) - *(long *)observables >> 3,
             (allocator_type *)&anon_var_0);
  do {
    readECUPacket((Bytes *)&anon_var_0,this,false);
    std::vector<std::byte,_std::allocator<std::byte>_>::_M_move_assign(&response,&anon_var_0);
    std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
              ((_Vector_base<std::byte,_std::allocator<std::byte>_> *)&anon_var_0);
    pbVar4 = response.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_start + 5;
    uVar3 = 0;
    while( true ) {
      if ((ulong)(*(long *)(observables + 8) - *(long *)observables >> 3) <= uVar3) break;
      puVar1 = *(undefined8 **)(*(long *)observables + uVar3 * 8);
      dVar5 = (double)(**(code **)*puVar1)(puVar1,pbVar4);
      values.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar3] = dVar5;
      iVar2 = (**(code **)(**(long **)(*(long *)observables + uVar3 * 8) + 0x18))();
      pbVar4 = pbVar4 + iVar2;
      uVar3 = uVar3 + 1;
    }
    iVar2 = std::
            function<int_(const_std::vector<const_SSM::Observable_*,_std::allocator<const_SSM::Observable_*>_>_&,_const_std::vector<double,_std::allocator<double>_>_&)>
            ::operator()(callback,observables,&values);
  } while (iVar2 == 0);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&values.super__Vector_base<double,_std::allocator<double>_>);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&response.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  return;
}

Assistant:

void ECUPort::continuousRead(const Observables& observables,
			       ReadValueCallback callback) const
  {
    sendRequest(buildReadRequest(observables, true));

    Bytes response(0);
    Values values(observables.size());
    Bytes::const_iterator it;

    while(true)
      {
	try { response = readECUPacket(false);}
	catch(InvalidChecksum) { continue; }
	it = skipToData(response);
	for(int i(0); i< observables.size(); i++)
	  {
	    values[i] = observables[i]->convert(it);
	    it += observables[i]->numBytes();
	  }
	if(callback(observables, values)) return;
      }
  }